

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bracket_notation_parser_impl.h
# Opt level: O3

Node<label::StringLabel> * __thiscall
parser::BracketNotationParser<label::StringLabel>::parse_single
          (Node<label::StringLabel> *__return_storage_ptr__,
          BracketNotationParser<label::StringLabel> *this,string *tree_string)

{
  pointer *pprVar1;
  pointer pcVar2;
  Node<label::StringLabel> *pNVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  pointer pbVar7;
  pointer pbVar8;
  string match_str;
  Node<label::StringLabel> *root;
  StringLabel node_label;
  StringLabel root_label;
  Node<label::StringLabel> n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  long *local_130;
  char *local_128;
  long local_120 [2];
  Node<label::StringLabel> *local_110;
  pointer local_108;
  long *local_100 [2];
  long local_f0 [2];
  StringLabel local_e0;
  reference_wrapper<node::Node<label::StringLabel>_> local_c0;
  undefined1 local_b8 [24];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  Node<label::StringLabel> local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_110 = __return_storage_ptr__;
  get_tokens(&local_48,this,tree_string);
  local_108 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_130 = local_120;
  pcVar2 = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar2,
             pcVar2 + local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
  pcVar5 = local_128;
  if (((local_128 == (char *)(this->kLeftBracket)._M_string_length) &&
      ((local_128 == (char *)0x0 ||
       (iVar4 = bcmp(local_130,(this->kLeftBracket)._M_dataplus._M_p,(size_t)local_128), iVar4 == 0)
       ))) || ((pcVar5 == (char *)(this->kRightBracket)._M_string_length &&
               ((pcVar5 == (char *)0x0 ||
                (iVar4 = bcmp(local_130,(this->kRightBracket)._M_dataplus._M_p,(size_t)pcVar5),
                iVar4 == 0)))))) {
    std::__cxx11::string::_M_replace((ulong)&local_130,0,pcVar5,0x10d145);
    pbVar7 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    pcVar5 = local_128;
  }
  else {
    pbVar7 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
  }
  local_e0.label_._M_dataplus._M_p = (pointer)&local_e0.label_.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_130,pcVar5 + (long)local_130);
  pNVar3 = local_110;
  node::Node<label::StringLabel>::Node(local_110,&local_e0);
  local_80.children_.
  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pNVar3;
  std::
  vector<std::reference_wrapper<node::Node<label::StringLabel>>,std::allocator<std::reference_wrapper<node::Node<label::StringLabel>>>>
  ::emplace_back<std::reference_wrapper<node::Node<label::StringLabel>>>
            ((vector<std::reference_wrapper<node::Node<label::StringLabel>>,std::allocator<std::reference_wrapper<node::Node<label::StringLabel>>>>
              *)this,(reference_wrapper<node::Node<label::StringLabel>_> *)&local_80);
  if (pbVar7 != local_108) {
    do {
      std::__cxx11::string::_M_assign((string *)&local_130);
      pcVar5 = local_128;
      lVar6 = 0x20;
      if ((local_128 == (char *)(this->kLeftBracket)._M_string_length) &&
         ((local_128 == (char *)0x0 ||
          (iVar4 = bcmp(local_130,(this->kLeftBracket)._M_dataplus._M_p,(size_t)local_128),
          iVar4 == 0)))) {
        pbVar8 = pbVar7 + 1;
        std::__cxx11::string::_M_assign((string *)&local_130);
        pcVar5 = local_128;
        if (((local_128 == (char *)(this->kLeftBracket)._M_string_length) &&
            ((local_128 == (char *)0x0 ||
             (iVar4 = bcmp(local_130,(this->kLeftBracket)._M_dataplus._M_p,(size_t)local_128),
             iVar4 == 0)))) ||
           ((pcVar5 == (char *)(this->kRightBracket)._M_string_length &&
            ((pcVar5 == (char *)0x0 ||
             (iVar4 = bcmp(local_130,(this->kRightBracket)._M_dataplus._M_p,(size_t)pcVar5),
             iVar4 == 0)))))) {
          std::__cxx11::string::_M_replace((ulong)&local_130,0,pcVar5,0x10d145);
          pcVar5 = local_128;
        }
        else {
          pbVar8 = pbVar7 + 2;
        }
        local_100[0] = local_f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_100,local_130,pcVar5 + (long)local_130);
        node::Node<label::StringLabel>::Node(&local_80,(ConstReference)local_100);
        pNVar3 = (this->node_stack).
                 super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
        std::
        vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
        vector((vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                *)local_b8,&local_80.children_);
        local_a0._M_p = (pointer)&local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_80.label_.label_._M_dataplus._M_p,
                   local_80.label_.label_._M_dataplus._M_p + local_80.label_.label_._M_string_length
                  );
        std::
        vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
        push_back(&pNVar3->children_,(value_type *)local_b8);
        local_c0._M_data =
             (pNVar3->children_).
             super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        std::
        vector<std::reference_wrapper<node::Node<label::StringLabel>>,std::allocator<std::reference_wrapper<node::Node<label::StringLabel>>>>
        ::emplace_back<std::reference_wrapper<node::Node<label::StringLabel>>>
                  ((vector<std::reference_wrapper<node::Node<label::StringLabel>>,std::allocator<std::reference_wrapper<node::Node<label::StringLabel>>>>
                    *)this,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_p != &local_90) {
          operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
        }
        std::
        vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
        ~vector((vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                 *)local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.label_.label_._M_dataplus._M_p != &local_80.label_.label_.field_2) {
          operator_delete(local_80.label_.label_._M_dataplus._M_p,
                          local_80.label_.label_.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
        ~vector(&local_80.children_);
        if (local_100[0] != local_f0) {
          operator_delete(local_100[0],local_f0[0] + 1);
        }
        lVar6 = 0;
        pcVar5 = local_128;
        pbVar7 = pbVar8;
      }
      if ((pcVar5 == (char *)(this->kRightBracket)._M_string_length) &&
         ((pcVar5 == (char *)0x0 ||
          (iVar4 = bcmp(local_130,(this->kRightBracket)._M_dataplus._M_p,(size_t)pcVar5), iVar4 == 0
          )))) {
        pprVar1 = &(this->node_stack).
                   super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pprVar1 = *pprVar1 + -1;
        lVar6 = 0x20;
      }
      pbVar7 = (pointer)((long)&(pbVar7->_M_dataplus)._M_p + lVar6);
    } while (pbVar7 != local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.label_._M_dataplus._M_p != &local_e0.label_.field_2) {
    operator_delete(local_e0.label_._M_dataplus._M_p,
                    local_e0.label_.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_110;
}

Assistant:

node::Node<Label> BracketNotationParser<Label>::parse_single(
    const std::string& tree_string) {

  std::vector<std::string> tokens = get_tokens(tree_string);

  // Tokenize the input string - get iterator over tokens.
  auto tokens_begin = tokens.begin();
  auto tokens_end = tokens.end();

  // Deal with the root node separately.
  ++tokens_begin; // Advance tokens to label.
  std::string match_str = *tokens_begin;
  if (match_str == kLeftBracket || match_str == kRightBracket) { // Root has an empty label.
    match_str = "";
    // Do not advance tokens - we're already at kLeftBracket or kRightBracket.
  } else { // Non-empty label.
    ++tokens_begin; // Advance tokens.
  }
  Label root_label(match_str);
  node::Node<Label> root(root_label);
  node_stack.push_back(std::ref(root));

  bool consumed_token = false;

  // Iterate all remaining tokens.
  while (tokens_begin != tokens_end) {
    match_str = *tokens_begin;
    consumed_token = false;

    if (match_str == kLeftBracket) { // Enter node.
      consumed_token = true;
      ++tokens_begin; // Advance tokens to label.
      match_str = *tokens_begin;

      if (match_str == kLeftBracket || match_str == kRightBracket) { // Node has an empty label.
        match_str = "";
        // Do not advance tokens - we're already at kLeftBracket or kRightBracket.
      } else { // Non-empty label.
        ++tokens_begin; // Advance tokens.
      }

      // Create new node.
      Label node_label(match_str);
      node::Node<Label> n(node_label);

      // Move n to become a child.
      // Return reference from add_child to the 'new-located' object.
      // Put a reference to just-moved n (last child of its parent) on a stack.
      node_stack.push_back(std::ref(node_stack.back().get().add_child(n)));
    }

    if (match_str == kRightBracket) { // Exit node.
      consumed_token = true;
      node_stack.pop_back();
      ++tokens_begin; // Advance tokens.
    }

    // Skip incorrect token.
    if (consumed_token == false) {
      ++tokens_begin; // Advance tokens.
    }
  }
  return root;
}